

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_test.cc
# Opt level: O2

int logger_timed_log_test(bool is_global)

{
  SimpleLogger *pSVar1;
  int __how;
  anon_class_16_2_486d2e63_for__M_head_impl *__f;
  thread t2;
  thread t1;
  SimpleLogger *local_80;
  int local_74;
  anon_class_16_2_486d2e63_for__M_head_impl worker_func;
  string filename;
  string prefix;
  
  std::__cxx11::string::string((string *)&prefix,"logger_timed_log_test",(allocator *)&filename);
  TestSuite::clearTestFile(&prefix,MIDDLE_OF_TEST);
  TestSuite::getTestFileName((string *)&worker_func,&prefix);
  std::operator+(&filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&worker_func,
                 ".log");
  std::__cxx11::string::~string((string *)&worker_func);
  std::chrono::_V2::system_clock::now();
  pSVar1 = (SimpleLogger *)operator_new(0x2c8);
  SimpleLogger::SimpleLogger(pSVar1,&filename,0x80,0x100000,0);
  local_80 = pSVar1;
  SimpleLogger::start(pSVar1);
  SimpleLogger::setLogLevel(pSVar1,6);
  worker_func.ll = &local_80;
  t2._M_id._M_thread._0_4_ = 1;
  worker_func.is_global = is_global;
  std::thread::thread<logger_timed_log_test(bool)::__0&,int,void>(&t1,&worker_func,(int *)&t2);
  local_74 = 2;
  __f = &worker_func;
  std::thread::thread<logger_timed_log_test(bool)::__0&,int,void>(&t2,__f,&local_74);
  __how = (int)__f;
  if (t1._M_id._M_thread != 0) {
    std::thread::join();
  }
  if (CONCAT44(t2._M_id._M_thread._4_4_,(undefined4)t2._M_id._M_thread) != 0) {
    std::thread::join();
  }
  pSVar1 = local_80;
  if (local_80 != (SimpleLogger *)0x0) {
    SimpleLogger::~SimpleLogger(local_80);
  }
  operator_delete(pSVar1);
  SimpleLogger::shutdown((int)pSVar1,__how);
  TestSuite::clearTestFile(&prefix,END_OF_TEST);
  std::thread::~thread(&t2);
  std::thread::~thread(&t1);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&prefix);
  return 0;
}

Assistant:

int logger_timed_log_test(bool is_global) {
    const std::string prefix = TEST_SUITE_AUTO_PREFIX;
    TestSuite::clearTestFile(prefix);
    std::string filename = TestSuite::getTestFileName(prefix) + ".log";

    SimpleLogger* ll = nullptr;
    TestSuite::Timer tt;

    ll = new SimpleLogger(filename, 128, 1024*1024, 0);
    ll->start();
    ll->setLogLevel(6);

    auto worker_func = [&ll, is_global](int tid) -> void {
        for (size_t ii=0; ii<100; ++ii) {
            SimpleLogger::Levels lv = (ii < 50)
                                      ? SimpleLogger::TRACE
                                      : SimpleLogger::UNKNOWN;
            if (is_global) {
                _timed_log_g(ll, 100, lv, SimpleLogger::INFO,
                             "thread %d, %zu", tid, ii);
            } else {
                _timed_log_t(ll, 100, lv, SimpleLogger::INFO,
                             "thread %d %zu", tid, ii);
            }
            TestSuite::sleep_ms(10);
        }
    };

    std::thread t1(worker_func, 1);
    std::thread t2(worker_func, 2);
    if (t1.joinable()) t1.join();
    if (t2.joinable()) t2.join();

    delete ll;

    SimpleLogger::shutdown();
    TestSuite::clearTestFile(prefix, TestSuite::END_OF_TEST);
    return 0;
}